

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_info.hpp
# Opt level: O2

string * __thiscall
iutest::TestInfo::test_name_with_where_abi_cxx11_(string *__return_storage_ptr__,TestInfo *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  if (((this->m_value_param)._M_string_length != 0) &&
     ((this->m_value_param)._M_dataplus._M_p != (pointer)0x0)) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

::std::string test_name_with_where() const
    {
        ::std::string str = m_testname;
        if( value_param() != NULL )
        {
            str += ", where GetParam() = ";
            str += m_value_param;
        }
        return str;
    }